

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

RsIfElseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RsIfElseSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::RsProdItemSyntax&,slang::syntax::RsElseClauseSyntax*>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3,
          RsProdItemSyntax *args_4,RsElseClauseSyntax **args_5)

{
  RsElseClauseSyntax *pRVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  RsIfElseSyntax *pRVar17;
  
  pRVar17 = (RsIfElseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RsIfElseSyntax *)this->endPtr < pRVar17 + 1) {
    pRVar17 = (RsIfElseSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pRVar17 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar2 = args->info;
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar3 = args_1->info;
  TVar13 = args_3->kind;
  uVar14 = args_3->field_0x2;
  NVar15.raw = (args_3->numFlags).raw;
  uVar16 = args_3->rawLen;
  pIVar4 = args_3->info;
  pRVar1 = *args_5;
  (pRVar17->super_RsProdSyntax).super_SyntaxNode.kind = RsIfElse;
  (pRVar17->super_RsProdSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pRVar17->super_RsProdSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pRVar17->keyword).kind = TVar5;
  (pRVar17->keyword).field_0x2 = uVar6;
  (pRVar17->keyword).numFlags = (NumericTokenFlags)NVar7.raw;
  (pRVar17->keyword).rawLen = uVar8;
  (pRVar17->keyword).info = pIVar2;
  (pRVar17->openParen).kind = TVar9;
  (pRVar17->openParen).field_0x2 = uVar10;
  (pRVar17->openParen).numFlags = (NumericTokenFlags)NVar11.raw;
  (pRVar17->openParen).rawLen = uVar12;
  (pRVar17->openParen).info = pIVar3;
  (pRVar17->condition).ptr = args_2;
  (pRVar17->closeParen).kind = TVar13;
  (pRVar17->closeParen).field_0x2 = uVar14;
  (pRVar17->closeParen).numFlags = (NumericTokenFlags)NVar15.raw;
  (pRVar17->closeParen).rawLen = uVar16;
  (pRVar17->closeParen).info = pIVar4;
  (pRVar17->ifItem).ptr = args_4;
  pRVar17->elseClause = pRVar1;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pRVar17;
  (args_4->super_RsProdSyntax).super_SyntaxNode.parent = (SyntaxNode *)pRVar17;
  if (pRVar1 != (RsElseClauseSyntax *)0x0) {
    (pRVar1->super_SyntaxNode).parent = (SyntaxNode *)pRVar17;
  }
  return pRVar17;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }